

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapchainImage.cpp
# Opt level: O0

vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
* myvk::SwapchainImage::Create(Ptr<Swapchain> *swapchain)

{
  value_type pVVar1;
  PFN_vkGetSwapchainImagesKHR p_Var2;
  VkImageUsageFlags VVar3;
  VkFormat VVar4;
  element_type *peVar5;
  element_type *peVar6;
  VkDevice pVVar7;
  VkSwapchainKHR pVVar8;
  VkImage_T **ppVVar9;
  reference ppVVar10;
  element_type *peVar11;
  VkExtent2D VVar12;
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  *in_RDI;
  shared_ptr<myvk::SwapchainImage> ptr;
  uint32_t i;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> images;
  uint32_t image_count;
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  *ret;
  shared_ptr<myvk::Swapchain> *in_stack_fffffffffffffec8;
  shared_ptr<myvk::Swapchain> *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *in_stack_fffffffffffffef0;
  uint32_t *puVar13;
  uint32_t uStack_78;
  uint32_t local_74;
  undefined8 local_6c;
  uint32_t local_64;
  shared_ptr<myvk::Swapchain> local_60;
  uint local_4c;
  allocator<std::shared_ptr<myvk::SwapchainImage>_> local_46;
  undefined1 local_45;
  allocator<VkImage_T_*> local_31;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_30;
  uint local_14 [5];
  
  p_Var2 = vkGetSwapchainImagesKHR;
  peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a42f9);
  (*(peVar5->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar6 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2a430d);
  pVVar7 = Device::GetHandle(peVar6);
  peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a432a);
  pVVar8 = Swapchain::GetHandle(peVar5);
  (*p_Var2)(pVVar7,pVVar8,local_14,(VkImage *)0x0);
  std::allocator<VkImage_T_*>::allocator((allocator<VkImage_T_*> *)0x2a4375);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator_type *)in_stack_fffffffffffffee0);
  std::allocator<VkImage_T_*>::~allocator(&local_31);
  p_Var2 = vkGetSwapchainImagesKHR;
  peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a43bd);
  (*(peVar5->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar6 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x2a43e0);
  pVVar7 = Device::GetHandle(peVar6);
  peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a43fc);
  pVVar8 = Swapchain::GetHandle(peVar5);
  ppVVar9 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::data
                      ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)0x2a4418);
  (*p_Var2)(pVVar7,pVVar8,local_14,ppVVar9);
  local_45 = 0;
  std::allocator<std::shared_ptr<myvk::SwapchainImage>_>::allocator
            ((allocator<std::shared_ptr<myvk::SwapchainImage>_> *)0x2a445c);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::vector((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
            *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  std::allocator<std::shared_ptr<myvk::SwapchainImage>_>::~allocator(&local_46);
  for (local_4c = 0; local_4c < local_14[0]; local_4c = local_4c + 1) {
    std::make_shared<myvk::SwapchainImage>();
    std::__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2a44cf);
    std::shared_ptr<myvk::Swapchain>::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8)
    ;
    ppVVar10 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::operator[]
                         (&local_30,(ulong)local_4c);
    pVVar1 = *ppVVar10;
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a4508);
    (peVar11->super_ImageBase).m_image = pVVar1;
    peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a451e);
    VVar3 = Swapchain::GetImageUsage(peVar5);
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a4539);
    (peVar11->super_ImageBase).m_usage = VVar3;
    puVar13 = (uint32_t *)&local_6c;
    peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a455a);
    VVar12 = Swapchain::GetExtent(peVar5);
    local_74 = VVar12.width;
    *puVar13 = local_74;
    in_stack_fffffffffffffee0 = (allocator_type *)((long)&local_6c + 4);
    peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a459e);
    VVar12 = Swapchain::GetExtent(peVar5);
    uStack_78 = VVar12.height;
    *(uint32_t *)in_stack_fffffffffffffee0 = uStack_78;
    local_64 = 0;
    in_stack_fffffffffffffed0 = &local_60;
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a45e5);
    (peVar11->super_ImageBase).m_extent.depth = local_64;
    (peVar11->super_ImageBase).m_extent.width = (undefined4)local_6c;
    (peVar11->super_ImageBase).m_extent.height = local_6c._4_4_;
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a4605);
    (peVar11->super_ImageBase).m_type = VK_IMAGE_TYPE_2D;
    peVar5 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a4619);
    VVar4 = Swapchain::GetImageFormat(peVar5);
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a4634);
    (peVar11->super_ImageBase).m_format = VVar4;
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a4648);
    (peVar11->super_ImageBase).m_mip_levels = 1;
    peVar11 = std::
              __shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a465c);
    (peVar11->super_ImageBase).m_array_layers = 1;
    std::
    vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
    ::operator[](in_RDI,(ulong)local_4c);
    std::shared_ptr<myvk::SwapchainImage>::operator=
              ((shared_ptr<myvk::SwapchainImage> *)in_stack_fffffffffffffed0,
               (shared_ptr<myvk::SwapchainImage> *)in_stack_fffffffffffffec8);
    std::shared_ptr<myvk::SwapchainImage>::~shared_ptr((shared_ptr<myvk::SwapchainImage> *)0x2a4696)
    ;
  }
  local_45 = 1;
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::~vector
            ((vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *)in_stack_fffffffffffffee0);
  return in_RDI;
}

Assistant:

std::vector<Ptr<SwapchainImage>> SwapchainImage::Create(const Ptr<Swapchain> &swapchain) {
	uint32_t image_count;
	vkGetSwapchainImagesKHR(swapchain->GetDevicePtr()->GetHandle(), swapchain->GetHandle(), &image_count, nullptr);
	std::vector<VkImage> images(image_count);
	vkGetSwapchainImagesKHR(swapchain->GetDevicePtr()->GetHandle(), swapchain->GetHandle(), &image_count,
	                        images.data());

	std::vector<Ptr<SwapchainImage>> ret(image_count);
	for (uint32_t i = 0; i < image_count; ++i) {
		auto ptr = std::make_shared<SwapchainImage>();
		ptr->m_swapchain_ptr = swapchain;
		ptr->m_image = images[i];

		ptr->m_usage = swapchain->GetImageUsage();
		ptr->m_extent = {swapchain->GetExtent().width, swapchain->GetExtent().height};
		ptr->m_type = VK_IMAGE_TYPE_2D;
		ptr->m_format = swapchain->GetImageFormat();
		ptr->m_mip_levels = 1;
		ptr->m_array_layers = 1;
		ret[i] = ptr;
	}
	return ret;
}